

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageFilledPolygon(gdImagePtr im,gdPointPtr p,int n,int c)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  gdPointPtr pgVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  gdPointPtr pgVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  gdPointPtr pgVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  
  if (n < 1) {
    return;
  }
  iVar16 = c;
  if (c == -7) {
    iVar16 = im->AA_color;
  }
  if (im->polyAllocated == 0) {
    iVar2 = overflow2(4,n);
    if (iVar2 != 0) {
      return;
    }
    piVar3 = (int *)gdMalloc((ulong)(uint)n << 2);
    im->polyInts = piVar3;
    if (piVar3 == (int *)0x0) {
      return;
    }
    im->polyAllocated = n;
  }
  if (im->polyAllocated < n) {
    iVar2 = im->polyAllocated;
    if (iVar2 < n) {
      do {
        iVar2 = iVar2 * 2;
      } while (iVar2 < n);
      im->polyAllocated = iVar2;
    }
    iVar2 = overflow2(4,iVar2);
    if (iVar2 != 0) {
      return;
    }
    piVar3 = (int *)gdReallocEx(im->polyInts,(long)im->polyAllocated << 2);
    im->polyInts = piVar3;
    if (piVar3 == (int *)0x0) {
      return;
    }
  }
  iVar2 = p->y;
  iVar6 = iVar2;
  if (n != 1) {
    uVar4 = 2;
    if (2 < n) {
      uVar4 = (ulong)(uint)n;
    }
    lVar12 = 0;
    do {
      iVar1 = p[lVar12 + 1].y;
      if (iVar1 < iVar6) {
        iVar6 = iVar1;
      }
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      lVar12 = lVar12 + 1;
    } while (uVar4 - 1 != lVar12);
  }
  if ((n != 1) && (iVar6 == iVar2)) {
    iVar16 = p->x;
    uVar4 = 2;
    if (2 < n) {
      uVar4 = (ulong)(uint)n;
    }
    uVar11 = 1;
    iVar2 = iVar16;
    do {
      iVar1 = p[uVar11].x;
      iVar9 = iVar16;
      if (iVar16 < iVar1) {
        iVar9 = iVar1;
      }
      if (iVar1 < iVar2) {
        iVar9 = iVar16;
        iVar2 = iVar1;
      }
      iVar16 = iVar9;
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
    gdImageLine(im,iVar2,iVar6,iVar16,iVar6,c);
    return;
  }
  iVar1 = im->cy1;
  if (im->cy1 < iVar6) {
    iVar1 = iVar6;
  }
  iVar6 = im->cy2;
  if (iVar2 < im->cy2) {
    iVar6 = iVar2;
  }
  if (iVar1 <= iVar6) {
    uVar4 = 1;
    if (1 < n) {
      uVar4 = (ulong)(uint)n;
    }
    do {
      uVar11 = 0;
      uVar17 = 0;
      pgVar5 = p;
      do {
        uVar7 = uVar11 & 0xffffffff;
        if (uVar11 == 0) {
          uVar7 = (ulong)(uint)n;
        }
        pgVar14 = p + (uVar7 - 1);
        iVar9 = p[uVar7 - 1].y;
        iVar8 = pgVar5->y;
        pgVar10 = pgVar5;
        iVar13 = iVar8;
        if ((iVar9 < iVar8) ||
           (bVar18 = iVar8 < iVar9, pgVar10 = pgVar14, pgVar14 = pgVar5, iVar13 = iVar9,
           iVar9 = iVar8, bVar18)) {
          iVar8 = pgVar10->x;
          if ((iVar1 < iVar9) || (iVar13 <= iVar1)) {
            if ((iVar1 != iVar2) || (iVar1 != iVar13)) goto LAB_0010e091;
          }
          else {
            iVar8 = (int)((float)pgVar14->x +
                         (float)((iVar8 - pgVar14->x) * (iVar1 - iVar9)) / (float)(iVar13 - iVar9) +
                         0.5);
          }
          lVar12 = (long)(int)uVar17;
          uVar17 = uVar17 + 1;
          im->polyInts[lVar12] = iVar8;
        }
LAB_0010e091:
        uVar11 = uVar11 + 1;
        pgVar5 = pgVar5 + 1;
      } while (uVar4 != uVar11);
      if (1 < (int)uVar17) {
        piVar3 = im->polyInts;
        uVar11 = 1;
        iVar9 = 2;
        do {
          iVar8 = piVar3[uVar11];
          iVar13 = iVar9;
          do {
            uVar15 = iVar13 - 1;
            if (piVar3[(ulong)uVar15 - 1] <= iVar8) goto LAB_0010e0df;
            piVar3[uVar15] = piVar3[(ulong)uVar15 - 1];
            iVar13 = iVar13 + -1;
          } while (1 < iVar13);
          uVar15 = 0;
LAB_0010e0df:
          piVar3[(int)uVar15] = iVar8;
          uVar11 = uVar11 + 1;
          iVar9 = iVar9 + 1;
        } while (uVar11 != uVar17);
      }
      if (1 < (int)uVar17) {
        lVar12 = 0;
        do {
          gdImageLine(im,im->polyInts[lVar12],iVar1,im->polyInts[lVar12 + 1],iVar1,iVar16);
          lVar12 = lVar12 + 2;
        } while ((int)lVar12 < (int)(uVar17 - 1));
      }
      bVar18 = iVar1 != iVar6;
      iVar1 = iVar1 + 1;
    } while (bVar18);
  }
  if (c != -7) {
    return;
  }
  gdImagePolygon(im,p,n,-7);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledPolygon (gdImagePtr im, gdPointPtr p, int n, int c)
{
	int i;
	int j;
	int index;
	int y;
	int miny, maxy, pmaxy;
	int x1, y1;
	int x2, y2;
	int ind1, ind2;
	int ints;
	int fill_color;
	if (n <= 0) {
		return;
	}

	if (c == gdAntiAliased) {
		fill_color = im->AA_color;
	} else {
		fill_color = c;
	}
	if (!im->polyAllocated) {
		if (overflow2(sizeof (int), n)) {
			return;
		}
		im->polyInts = (int *) gdMalloc (sizeof (int) * n);
		if (!im->polyInts) {
			return;
		}
		im->polyAllocated = n;
	}
	if (im->polyAllocated < n) {
		while (im->polyAllocated < n) {
			im->polyAllocated *= 2;
		}
		if (overflow2(sizeof (int), im->polyAllocated)) {
			return;
		}
		im->polyInts = (int *) gdReallocEx (im->polyInts,
						    sizeof (int) * im->polyAllocated);
		if (!im->polyInts) {
			return;
		}
	}
	miny = p[0].y;
	maxy = p[0].y;
	for (i = 1; (i < n); i++) {
		if (p[i].y < miny) {
			miny = p[i].y;
		}
		if (p[i].y > maxy) {
			maxy = p[i].y;
		}
	}
	/* necessary special case: horizontal line */
	if (n > 1 && miny == maxy) {
		x1 = x2 = p[0].x;
		for (i = 1; (i < n); i++) {
			if (p[i].x < x1) {
				x1 = p[i].x;
			} else if (p[i].x > x2) {
				x2 = p[i].x;
			}
		}
		gdImageLine(im, x1, miny, x2, miny, c);
		return;
	}
	pmaxy = maxy;
	/* 2.0.16: Optimization by Ilia Chipitsine -- don't waste time offscreen */
	/* 2.0.26: clipping rectangle is even better */
	if (miny < im->cy1) {
		miny = im->cy1;
	}
	if (maxy > im->cy2) {
		maxy = im->cy2;
	}
	/* Fix in 1.3: count a vertex only once */
	for (y = miny; (y <= maxy); y++) {
		ints = 0;
		for (i = 0; (i < n); i++) {
			if (!i) {
				ind1 = n - 1;
				ind2 = 0;
			} else {
				ind1 = i - 1;
				ind2 = i;
			}
			y1 = p[ind1].y;
			y2 = p[ind2].y;
			if (y1 < y2) {
				x1 = p[ind1].x;
				x2 = p[ind2].x;
			} else if (y1 > y2) {
				y2 = p[ind1].y;
				y1 = p[ind2].y;
				x2 = p[ind1].x;
				x1 = p[ind2].x;
			} else {
				continue;
			}

			/* Do the following math as float intermediately, and round to ensure
			 * that Polygon and FilledPolygon for the same set of points have the
			 * same footprint. */

			if ((y >= y1) && (y < y2)) {
				im->polyInts[ints++] = (int) ((float) ((y - y1) * (x2 - x1)) /
				                              (float) (y2 - y1) + 0.5 + x1);
			} else if ((y == pmaxy) && (y == y2)) {
				im->polyInts[ints++] = x2;
			}
		}
		/*
		  2.0.26: polygons pretty much always have less than 100 points,
		  and most of the time they have considerably less. For such trivial
		  cases, insertion sort is a good choice. Also a good choice for
		  future implementations that may wish to indirect through a table.
		*/
		for (i = 1; (i < ints); i++) {
			index = im->polyInts[i];
			j = i;
			while ((j > 0) && (im->polyInts[j - 1] > index)) {
				im->polyInts[j] = im->polyInts[j - 1];
				j--;
			}
			im->polyInts[j] = index;
		}
		for (i = 0; (i < (ints-1)); i += 2) {
			/* 2.0.29: back to gdImageLine to prevent segfaults when
			  performing a pattern fill */
			gdImageLine (im, im->polyInts[i], y, im->polyInts[i + 1], y,
			             fill_color);
		}
	}
	/* If we are drawing this AA, then redraw the border with AA lines. */
	/* This doesn't work as well as I'd like, but it doesn't clash either. */
	if (c == gdAntiAliased) {
		gdImagePolygon (im, p, n, c);
	}
}